

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O1

Error * ot::commissioner::RestoreDirPath(Error *__return_storage_ptr__,string *aPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  int *piVar7;
  Error *pEVar8;
  size_type __pos;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  string path;
  Error error;
  string dirName;
  writer write;
  string baseName;
  string local_168;
  undefined1 local_148 [8];
  char *pcStack_140;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
  *local_128;
  code *local_120;
  code *local_118;
  type local_110;
  pointer local_108;
  size_type local_100;
  char local_f8;
  undefined7 uStack_f7;
  undefined8 uStack_f0;
  Error *local_e8;
  string local_e0;
  string local_c0;
  writer local_a0;
  string local_98;
  string local_78 [2];
  
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  local_c0._M_string_length = 0;
  local_c0.field_2._M_local_buf[0] = '\0';
  local_108 = &local_f8;
  local_110 = none_type;
  local_100 = 0;
  local_f8 = '\0';
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  pcVar2 = (aPath->_M_dataplus)._M_p;
  local_e8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_168,pcVar2,pcVar2 + aPath->_M_string_length);
  do {
    local_138._M_allocated_capacity._0_2_ = 0x2f;
    pcStack_140 = (char *)0x1;
    local_148 = (undefined1  [8])&local_138;
    pcVar5 = (char *)EndsWithAtPos(&local_168,(string *)local_148);
    if (local_148 != (undefined1  [8])&local_138) {
      operator_delete((void *)local_148);
    }
    if (pcVar5 == (char *)0xffffffffffffffff) {
      pcStack_140 = (char *)0x2;
      local_138._M_allocated_capacity._0_3_ = 0x2e2f;
      local_148 = (undefined1  [8])&local_138;
      pcVar5 = (char *)EndsWithAtPos(&local_168,(string *)local_148);
      if (local_148 != (undefined1  [8])&local_138) {
        operator_delete((void *)local_148);
      }
      if (pcVar5 == (char *)0xffffffffffffffff) {
        pcStack_140 = (char *)0x3;
        local_138._M_allocated_capacity._0_4_ = 0x2e2e2f;
        local_148 = (undefined1  [8])&local_138;
        pcVar5 = (char *)EndsWithAtPos(&local_168,(string *)local_148);
        if (local_148 != (undefined1  [8])&local_138) {
          operator_delete((void *)local_148);
        }
        if (pcVar5 == (char *)0xffffffffffffffff) break;
      }
    }
    local_168._M_dataplus._M_p[(long)pcVar5] = '\0';
    local_168._M_string_length = (size_type)pcVar5;
  } while( true );
  if ((char *)local_168._M_string_length == (char *)0x0) {
    local_148._0_4_ = string_type;
    pcStack_140 = "Nothing to create for {}";
    local_138._M_allocated_capacity = 0x18;
    local_138._8_8_ = 0x100000000;
    local_120 = ::fmt::v10::detail::
                parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar5 = "Nothing to create for {}";
    local_128 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                 *)local_148;
    do {
      pcVar6 = pcVar5 + 1;
      if (*pcVar5 == '}') {
        if ((pcVar6 == "") || (*pcVar6 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar6 = pcVar5 + 2;
      }
      else if (*pcVar5 == '{') {
        pcVar6 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (pcVar5,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_148);
      }
      pcVar5 = pcVar6;
    } while (pcVar6 != "");
    local_148 = (undefined1  [8])(aPath->_M_dataplus)._M_p;
    pcStack_140 = (char *)aPath->_M_string_length;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x18;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_148;
    ::fmt::v10::vformat_abi_cxx11_(&local_e0,(v10 *)"Nothing to create for {}",fmt,args);
    pEVar8 = local_e8;
    local_e8->mCode = kAlreadyExists;
    (local_e8->mMessage)._M_dataplus._M_p = (pointer)&(local_e8->mMessage).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8->mMessage,local_e0._M_dataplus._M_p,
               local_e0._M_dataplus._M_p + local_e0._M_string_length);
  }
  else {
    local_78[0]._M_dataplus._M_p = (pointer)&local_78[0].field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_78,local_168._M_dataplus._M_p,
               (char *)(local_168._M_string_length + (long)local_168._M_dataplus._M_p));
    PathExists((Error *)local_148,local_78);
    local_110 = local_148._0_4_;
    std::__cxx11::string::operator=((string *)&local_108,(string *)&pcStack_140);
    if (pcStack_140 != local_138._M_local_buf + 8) {
      operator_delete(pcStack_140);
    }
    pEVar8 = local_e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78[0]._M_dataplus._M_p != &local_78[0].field_2) {
      operator_delete(local_78[0]._M_dataplus._M_p);
    }
    if (local_110 == none_type) {
LAB_00122a13:
      pEVar8->mCode = local_110;
      paVar1 = &(pEVar8->mMessage).field_2;
      (pEVar8->mMessage)._M_dataplus._M_p = (pointer)paVar1;
      if (local_108 == &local_f8) {
        paVar1->_M_allocated_capacity = CONCAT71(uStack_f7,local_f8);
        *(undefined8 *)((long)&(pEVar8->mMessage).field_2 + 8) = uStack_f0;
      }
      else {
        (pEVar8->mMessage)._M_dataplus._M_p = local_108;
        (pEVar8->mMessage).field_2._M_allocated_capacity = CONCAT71(uStack_f7,local_f8);
      }
      (pEVar8->mMessage)._M_string_length = local_100;
      local_100 = 0;
      local_f8 = '\0';
      local_108 = &local_f8;
      goto LAB_00122cf4;
    }
    SplitPath(&local_168,&local_c0,&local_98);
    if (local_c0._M_string_length == 0) {
      local_148._0_4_ = string_type;
      pcVar5 = "Path restoration impossible for path {}";
      pcStack_140 = "Path restoration impossible for path {}";
      local_138._M_allocated_capacity = 0x27;
      local_138._8_8_ = 0x100000000;
      local_120 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_128 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                   *)local_148;
      local_a0.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
            *)local_148;
      do {
        if (pcVar5 == "") break;
        pcVar6 = pcVar5;
        if (*pcVar5 == '{') {
LAB_00122aca:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&local_a0,pcVar5,pcVar6);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar6,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_148);
          bVar9 = true;
        }
        else {
          pcVar6 = pcVar5 + 1;
          bVar9 = pcVar6 != "";
          if (bVar9) {
            if (*pcVar6 != '{') {
              pcVar3 = pcVar5 + 2;
              do {
                pcVar6 = pcVar3;
                bVar9 = pcVar6 != "";
                if (pcVar6 == "") goto LAB_00122ac6;
                pcVar3 = pcVar6 + 1;
              } while (*pcVar6 != '{');
            }
            bVar9 = true;
          }
LAB_00122ac6:
          if (bVar9) goto LAB_00122aca;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::writer::operator()((writer *)&local_a0,pcVar5,"");
          bVar9 = false;
        }
      } while (bVar9);
      local_148 = (undefined1  [8])(aPath->_M_dataplus)._M_p;
      pcStack_140 = (char *)aPath->_M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x27;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)local_148;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e0,(v10 *)"Path restoration impossible for path {}",fmt_00,args_00);
      pEVar8 = local_e8;
      local_e8->mCode = kRejected;
      (local_e8->mMessage)._M_dataplus._M_p = (pointer)&(local_e8->mMessage).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8->mMessage,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
    }
    else {
      RestoreDirPath((Error *)local_148,&local_c0);
      local_110 = local_148._0_4_;
      std::__cxx11::string::operator=((string *)&local_108,(string *)&pcStack_140);
      if (pcStack_140 != local_138._M_local_buf + 8) {
        operator_delete(pcStack_140);
      }
      pEVar8 = local_e8;
      if ((local_110 != none_type) && (local_110 != string_type)) goto LAB_00122a13;
      iVar4 = mkdir(local_168._M_dataplus._M_p,0x1f8);
      if (iVar4 != -1) {
        pEVar8->mCode = kNone;
        (pEVar8->mMessage)._M_dataplus._M_p = (pointer)&(pEVar8->mMessage).field_2;
        (pEVar8->mMessage)._M_string_length = 0;
        (pEVar8->mMessage).field_2._M_local_buf[0] = '\0';
        goto LAB_00122cf4;
      }
      local_148._0_4_ = string_type;
      local_148._4_4_ = cstring_type;
      pcVar5 = "Failed to create directory {}: {}";
      pcStack_140 = "Failed to create directory {}: {}";
      local_138._M_allocated_capacity = 0x21;
      local_138._8_8_ = 0x200000000;
      local_120 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_118 = ::fmt::v10::detail::
                  parse_format_specs<char*,fmt::v10::detail::compile_parse_context<char>>;
      local_128 = (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                   *)local_148;
      local_a0.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
            *)local_148;
      do {
        if (pcVar5 == "") break;
        pcVar6 = pcVar5;
        if (*pcVar5 == '{') {
LAB_00122c35:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
          ::writer::operator()(&local_a0,pcVar5,pcVar6);
          pcVar5 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,char*>&>
                             (pcVar6,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>
                               *)local_148);
          bVar9 = true;
        }
        else {
          pcVar6 = pcVar5 + 1;
          bVar9 = pcVar6 != "";
          if (bVar9) {
            if (*pcVar6 != '{') {
              pcVar3 = pcVar5 + 2;
              do {
                pcVar6 = pcVar3;
                bVar9 = pcVar6 != "";
                if (pcVar6 == "") goto LAB_00122c31;
                pcVar3 = pcVar6 + 1;
              } while (*pcVar6 != '{');
            }
            bVar9 = true;
          }
LAB_00122c31:
          if (bVar9) goto LAB_00122c35;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char_*>_>
          ::writer::operator()(&local_a0,pcVar5,"");
          bVar9 = false;
        }
      } while (bVar9);
      piVar7 = __errno_location();
      local_138._M_allocated_capacity = (size_type)strerror(*piVar7);
      local_148 = (undefined1  [8])local_168._M_dataplus._M_p;
      pcStack_140 = (char *)local_168._M_string_length;
      fmt_01.size_ = 0xcd;
      fmt_01.data_ = (char *)0x21;
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)local_148;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_e0,(v10 *)"Failed to create directory {}: {}",fmt_01,args_01);
      pEVar8 = local_e8;
      local_e8->mCode = kIOError;
      (local_e8->mMessage)._M_dataplus._M_p = (pointer)&(local_e8->mMessage).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8->mMessage,local_e0._M_dataplus._M_p,
                 local_e0._M_dataplus._M_p + local_e0._M_string_length);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
LAB_00122cf4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  return pEVar8;
}

Assistant:

Error RestoreDirPath(const std::string &aPath)
{
    std::string baseName;
    std::string dirName;
    Error       error;

    std::string path = aPath;
    RemoveTrailings(path);

    if (path.empty())
    {
        // Nothing to restore: everything possible is already present in the FS:
        // aPath is either the root directory or relative to the current directory without any named component.
        return ERROR_ALREADY_EXISTS("Nothing to create for {}", aPath);
    }

    // Check path exists
    error = PathExists(path);
    if (error == ERROR_NONE)
    {
        return error;
    }

    SplitPath(path, dirName, baseName);
    if (dirName.empty())
    {
        // (baseName == path) => it is already known the path restoration is impossible (from the caller level)
        return ERROR_REJECTED("Path restoration impossible for path {}", aPath);
    }

    error = RestoreDirPath(dirName);
    if (error.GetCode() != ErrorCode::kNone && error.GetCode() != ErrorCode::kAlreadyExists)
    {
        return error;
    }

    int result = mkdir(path.c_str(), 0770);
    if (result == -1)
    {
        return ERROR_IO_ERROR("Failed to create directory {}: {}", path, strerror(errno));
    }

    return ERROR_NONE;
}